

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O0

void soul::heart::Utilities::inlineFunctionsThatUseAdvanceOrStreams<soul::Optimisations>
               (Program *program)

{
  bool bVar1;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *this;
  pool_ref *this_00;
  Module *pMVar2;
  pool_ref<soul::Module> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  anon_class_8_1_70e95164 inlineNextOccurrence;
  Program *program_local;
  
  __range2 = (vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *
             )program;
  inlineNextOccurrence.program = program;
  this = Program::getModules(program);
  __end2 = std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::begin(this);
  m = (pool_ref<soul::Module> *)
      std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::end
                (this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                     *)&m), bVar1) {
    this_00 = (pool_ref *)
              __gnu_cxx::
              __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
              ::operator*(&__end2);
    pMVar2 = pool_ref<soul::Module>::operator->((pool_ref<soul::Module> *)this_00);
    bVar1 = Module::isProcessor(pMVar2);
    if (bVar1) {
      do {
        pMVar2 = pool_ref::operator_cast_to_Module_(this_00);
        bVar1 = inlineFunctionsThatUseAdvanceOrStreams<soul::Optimisations>::anon_class_8_1_70e95164
                ::operator()((anon_class_8_1_70e95164 *)&__range2,pMVar2);
      } while (bVar1);
    }
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void inlineFunctionsThatUseAdvanceOrStreams (Program& program)
    {
        auto inlineNextOccurrence = [&] (Module& module) -> bool
        {
            for (auto& f : module.functions.get())
            {
                if (! f->functionType.isRun())
                {
                    auto s = findFirstStreamAccess (f);
                    auto a = findFirstAdvanceCall (f);

                    if (s != nullptr || a != nullptr)
                    {
                        if (f->functionType.isUserInit() || f->functionType.isEvent())
                        {
                            if (a != nullptr)
                                a->location.throwError (Errors::advanceCannotBeCalledHere());

                            if (f->functionType.isUserInit())
                                s->location.throwError (Errors::streamsCannotBeUsedDuringInit());
                            else
                                s->location.throwError (Errors::streamsCannotBeUsedInEventCallbacks());
                        }

                        if (OptimiserClass::inlineAllCallsToFunction (program, f))
                            return true;

                        if (a != nullptr)
                            a->location.throwError (Errors::advanceCannotBeCalledHere());

                        s->location.throwError (Errors::streamsCanOnlyBeUsedInRun());
                    }
                }
            }

            return false;
        };

        for (auto& m : program.getModules())
        {
            if (m->isProcessor())
            {
                while (inlineNextOccurrence (m))
                {}
            }
        }
    }